

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_f2c_variable.cpp
# Opt level: O2

void adios2_set_operation_parameter_f2c_
               (adios2_variable **variable,int *operation_id,char *key,char *value,int *ierr)

{
  int iVar1;
  invalid_argument *this;
  
  if (-1 < *operation_id) {
    iVar1 = adios2_set_operation_parameter(*variable);
    *ierr = iVar1;
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this,"ERROR: operation_id can\'t be negative, in call to adios2_set_operation_paramter"
            );
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FC_GLOBAL(adios2_set_operation_parameter_f2c,
               ADIOS2_SET_OPERATION_PARAMETER_F2C)(adios2_variable **variable,
                                                   const int *operation_id, const char *key,
                                                   const char *value, int *ierr)
{
    try
    {
        if (*operation_id < 0)
        {
            throw std::invalid_argument("ERROR: operation_id can't be "
                                        "negative, in call to "
                                        "adios2_set_operation_paramter");
        }

        *ierr = static_cast<int>(adios2_set_operation_parameter(
            *variable, static_cast<std::size_t>(*operation_id), key, value));
    }
    catch (...)
    {
        *ierr =
            static_cast<int>(adios2::helper::ExceptionToError("adios2_set_operation_parameter"));
    }
}